

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

void modifyAigToApplySafetyInvar(Aig_Man_t *pAig,int csTarget,int safetyInvarPO)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pObjCSTargetNew;
  Aig_Obj_t *pObjCSTarget;
  Aig_Obj_t *pObjPOCSTarget;
  Aig_Obj_t *pObjSafetyInvar;
  Aig_Obj_t *pObjPOSafetyInvar;
  int safetyInvarPO_local;
  int csTarget_local;
  Aig_Man_t *pAig_local;
  
  pAVar2 = Aig_ManCo(pAig,safetyInvarPO);
  pAVar3 = Aig_ObjFanin0(pAVar2);
  iVar1 = Aig_ObjFaninC0(pAVar2);
  pAVar2 = Aig_NotCond(pAVar3,iVar1);
  pAVar3 = Aig_ManCo(pAig,csTarget);
  pAVar4 = Aig_ObjFanin0(pAVar3);
  iVar1 = Aig_ObjFaninC0(pAVar3);
  pAVar4 = Aig_NotCond(pAVar4,iVar1);
  pAVar2 = Aig_And(pAig,pAVar2,pAVar4);
  Aig_ObjPatchFanin0(pAig,pAVar3,pAVar2);
  return;
}

Assistant:

void modifyAigToApplySafetyInvar(Aig_Man_t *pAig, int csTarget, int safetyInvarPO)
{
	Aig_Obj_t *pObjPOSafetyInvar, *pObjSafetyInvar;
	Aig_Obj_t *pObjPOCSTarget, *pObjCSTarget;
	Aig_Obj_t *pObjCSTargetNew;

	pObjPOSafetyInvar = Aig_ManCo( pAig, safetyInvarPO );
	pObjSafetyInvar =  Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPOSafetyInvar), Aig_ObjFaninC0(pObjPOSafetyInvar));	
	pObjPOCSTarget = Aig_ManCo( pAig, csTarget );
	pObjCSTarget = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPOCSTarget), Aig_ObjFaninC0(pObjPOCSTarget));	

	pObjCSTargetNew = Aig_And( pAig, pObjSafetyInvar, pObjCSTarget );
	Aig_ObjPatchFanin0( pAig, pObjPOCSTarget, pObjCSTargetNew );
}